

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O1

string * __thiscall
duckdb::BindContext::BindColumn
          (string *__return_storage_ptr__,BindContext *this,PositionalReferenceExpression *ref,
          string *table_name,string *column_name)

{
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar1;
  bool bVar2;
  type pBVar3;
  ulong uVar4;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *entry;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *this_00;
  string *psVar5;
  ulong __n;
  bool bVar6;
  unsigned_long local_78;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = (this->bindings_list).
            super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->bindings_list).
           super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = this_00 == puVar1;
  psVar5 = column_name;
  if (bVar6) {
    local_78 = 0;
  }
  else {
    __n = ref->index - 1;
    local_78 = 0;
    do {
      pBVar3 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator*
                         (this_00);
      if (ref->index == 0) {
        BindingAlias::GetAlias_abi_cxx11_(&pBVar3->alias);
        ::std::__cxx11::string::_M_assign((string *)table_name);
        bVar2 = false;
        psVar5 = (string *)0x5;
        ::std::__cxx11::string::_M_replace
                  ((ulong)column_name,0,(char *)column_name->_M_string_length,0x1e25a1b);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        uVar4 = (long)(pBVar3->names).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pBVar3->names).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (__n < uVar4) {
          BindingAlias::GetAlias_abi_cxx11_(&pBVar3->alias);
          ::std::__cxx11::string::_M_assign((string *)table_name);
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::operator[](&pBVar3->names,__n);
          ::std::__cxx11::string::_M_assign((string *)column_name);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          bVar2 = false;
        }
        else {
          local_78 = local_78 + uVar4;
          bVar2 = true;
          __n = __n - uVar4;
        }
      }
      if (!bVar2) break;
      this_00 = this_00 + 1;
      bVar6 = this_00 == puVar1;
    } while (!bVar6);
  }
  if (bVar6) {
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Positional reference %d out of range (total %d columns)","");
    Exception::ConstructMessage<unsigned_long,unsigned_long>
              (__return_storage_ptr__,(Exception *)local_50,(string *)ref->index,local_78,
               (unsigned_long)psVar5);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string BindContext::BindColumn(PositionalReferenceExpression &ref, string &table_name, string &column_name) {
	idx_t total_columns = 0;
	idx_t current_position = ref.index - 1;
	for (auto &entry : bindings_list) {
		auto &binding = *entry;
		idx_t entry_column_count = binding.names.size();
		if (ref.index == 0) {
			// this is a row id
			table_name = binding.alias.GetAlias();
			column_name = "rowid";
			return string();
		}
		if (current_position < entry_column_count) {
			table_name = binding.alias.GetAlias();
			column_name = binding.names[current_position];
			return string();
		} else {
			total_columns += entry_column_count;
			current_position -= entry_column_count;
		}
	}
	return StringUtil::Format("Positional reference %d out of range (total %d columns)", ref.index, total_columns);
}